

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

int __thiscall glcts::anon_unknown_0::UniformType::abs(UniformType *this,int __x)

{
  GLenum GVar1;
  int iVar2;
  
  GVar1 = this->baseType;
  if (GVar1 == 0x1404) {
    iVar2 = 0x1644694;
  }
  else {
    iVar2 = 0x1773ca3;
    if ((GVar1 != 0x82e6) && (GVar1 != 0x1406)) {
      if (GVar1 == 0x1405) {
        return 0x171d392;
      }
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                    ,0x14e,"const char *glcts::(anonymous namespace)::UniformType::abs() const");
    }
  }
  return iVar2;
}

Assistant:

const char* abs() const
	{
		switch (baseType)
		{
		case GL_FLOAT:
		case GL_SAMPLER:
			return "0.1";
		case GL_UNSIGNED_INT:
			return "0u";
		case GL_INT:
			return "0";
		default:
			assert(0);
			return "";
		}
	}